

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

int32_t __thiscall wasm::WasmBinaryWriter::writeU32LEBPlaceholder(WasmBinaryWriter *this)

{
  int iVar1;
  int iVar2;
  BufferWithRandomAccess *this_00;
  uchar local_19;
  
  this_00 = this->o;
  iVar1 = *(int *)&(this_00->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(this_00->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  BufferWithRandomAccess::operator<<(this_00,0);
  local_19 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_19);
  return iVar1 - iVar2;
}

Assistant:

int32_t WasmBinaryWriter::writeU32LEBPlaceholder() {
  int32_t ret = o.size();
  o << int32_t(0);
  o << int8_t(0);
  return ret;
}